

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  MESSAGE_RECEIVER_STATE MStack_8;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if (*(int *)((long)context + 0x18) - 3U < 2) {
      MStack_8 = MESSAGE_RECEIVER_STATE_IDLE;
      goto LAB_0012af82;
    }
    if (*(int *)((long)context + 0x18) == 1) {
      return;
    }
  }
  else {
    if (new_link_state != LINK_STATE_ERROR) {
      if ((new_link_state != LINK_STATE_ATTACHED) || (*(int *)((long)context + 0x18) != 2)) {
        return;
      }
      MStack_8 = MESSAGE_RECEIVER_STATE_OPEN;
      goto LAB_0012af82;
    }
    if (*(int *)((long)context + 0x18) == 5) {
      return;
    }
  }
  MStack_8 = MESSAGE_RECEIVER_STATE_ERROR;
LAB_0012af82:
  set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MStack_8);
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_SENDER_INSTANCE* message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_CLOSING))
        {
            /* switch to closing so that no more requests should be accepted */
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_IDLE);
        }
        else if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_ERROR)
        {
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    }
}